

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void duplicate_general_repeat(Am_Object *command_obj,bool reload_data,Am_Value *new_sel)

{
  Am_Wrapper *pAVar1;
  Am_Value *pAVar2;
  Am_Value_List local_100;
  Am_Object local_f0;
  Am_Value_List local_e8;
  Am_Value_List local_d8;
  Am_Value_List local_c8;
  Am_Value_List local_b8;
  Am_Value local_a8;
  Am_Object local_98;
  undefined1 local_90 [8];
  Am_Value_List copy_copy_objs;
  Am_Object local_78;
  undefined1 local_70 [8];
  Am_Value_List old_selection;
  Am_Value_List copy_objs;
  Am_Value_List orig_objs;
  Am_Object local_30;
  Am_Object group;
  Am_Object selection_widget;
  Am_Value *new_sel_local;
  bool reload_data_local;
  Am_Object *command_obj_local;
  
  Am_Object::Am_Object(&group);
  Am_Object::Am_Object(&local_30);
  Am_Value_List::Am_Value_List((Am_Value_List *)&copy_objs.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&old_selection.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_70);
  Am_Object::Am_Object((Am_Object *)&copy_copy_objs.item,command_obj);
  Am_Get_Selection_Widget_For_Command(&local_78);
  Am_Object::operator=(&group,&local_78);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object((Am_Object *)&copy_copy_objs.item);
  if (reload_data) {
    Am_Value_List::Am_Value_List((Am_Value_List *)local_90);
    Am_Object::Am_Object(&local_98,&group);
    Am_Value::Am_Value(&local_a8,new_sel);
    Am_Get_Sel_Or_Param_In_Display_Order
              (&local_98,(Am_Value_List *)&copy_objs.item,&local_30,&local_a8);
    Am_Value::~Am_Value(&local_a8);
    Am_Object::~Am_Object(&local_98);
    Am_Object::Set(command_obj,0x16d,new_sel,0);
    Am_Value_List::Am_Value_List(&local_c8,(Am_Value_List *)&copy_objs.item);
    Am_Copy_Object_List(&local_b8,(Am_Object *)&local_c8,0x421b48);
    Am_Value_List::operator=((Am_Value_List *)local_90,&local_b8);
    Am_Value_List::~Am_Value_List(&local_b8);
    Am_Value_List::~Am_Value_List(&local_c8);
    pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_90);
    Am_Object::Set(command_obj,0x11a,pAVar1,0);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_90);
  }
  else {
    pAVar2 = Am_Object::Get(command_obj,0x11a,0);
    Am_Value_List::operator=((Am_Value_List *)&copy_objs.item,pAVar2);
    pAVar2 = Am_Object::Get(command_obj,0x171,0);
    Am_Object::operator=(&local_30,pAVar2);
  }
  Am_Value_List::Am_Value_List(&local_e8,(Am_Value_List *)&copy_objs.item);
  Am_Copy_Object_List(&local_d8,(Am_Object *)&local_e8,(int)&local_30);
  Am_Value_List::operator=((Am_Value_List *)&old_selection.item,&local_d8);
  Am_Value_List::~Am_Value_List(&local_d8);
  Am_Value_List::~Am_Value_List(&local_e8);
  Am_Object::Set(command_obj,0x16f,false,0);
  Am_Object::Am_Object(&local_f0,&local_30);
  Am_Value_List::Am_Value_List(&local_100,(Am_Value_List *)&old_selection.item);
  Am_Put_Objects_Into_Group(&local_f0,&local_100);
  Am_Value_List::~Am_Value_List(&local_100);
  Am_Object::~Am_Object(&local_f0);
  pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&old_selection.item);
  Am_Object::Set(command_obj,0x169,pAVar1,0);
  pAVar2 = Am_Object::Get(&group,0x169,0);
  Am_Value_List::operator=((Am_Value_List *)local_70,pAVar2);
  pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_70);
  Am_Object::Set(command_obj,0x16c,pAVar1,0);
  pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&old_selection.item);
  Am_Object::Set(&group,0x169,pAVar1,0);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_70);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&old_selection.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&copy_objs.item);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&group);
  return;
}

Assistant:

void
duplicate_general_repeat(Am_Object command_obj, bool reload_data,
                         Am_Value new_sel)
{
  // repeat = duplicate a new copy of the objects
  Am_Object selection_widget, group;
  Am_Value_List orig_objs, copy_objs, old_selection;
  selection_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  if (reload_data) {
    Am_Value_List copy_copy_objs;
    Am_Get_Sel_Or_Param_In_Display_Order(selection_widget, orig_objs, group,
                                         new_sel);
    command_obj.Set(Am_OBJECT_MODIFIED, new_sel);
    copy_copy_objs = Am_Copy_Object_List(orig_objs);
    command_obj.Set(Am_START_OBJECT, copy_copy_objs); //in case repeat
  } else {
    orig_objs = command_obj.Get(Am_START_OBJECT);
    group = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
  }
  copy_objs = Am_Copy_Object_List(orig_objs, group, DUPLICATE_OFFSET);
  command_obj.Set(Am_HAS_BEEN_UNDONE, false);
  Am_Put_Objects_Into_Group(group, copy_objs);
  command_obj.Set(Am_VALUE, copy_objs);
  old_selection = selection_widget.Get(Am_VALUE);
  command_obj.Set(Am_OLD_VALUE, old_selection);
  selection_widget.Set(Am_VALUE, copy_objs);
}